

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hh
# Opt level: O2

fixed_depth_iterator * __thiscall
tree<libDAI::BoundTreeNode,std::allocator<tree_node_<libDAI::BoundTreeNode>>>::
append_child<tree<libDAI::BoundTreeNode,std::allocator<tree_node_<libDAI::BoundTreeNode>>>::fixed_depth_iterator>
          (fixed_depth_iterator *__return_storage_ptr__,
          tree<libDAI::BoundTreeNode,std::allocator<tree_node_<libDAI::BoundTreeNode>>> *this,
          fixed_depth_iterator *position,BoundTreeNode *x)

{
  tree_node *ptVar1;
  tree_node_<libDAI::BoundTreeNode> *ptVar2;
  size_t sVar3;
  bool bVar4;
  undefined3 uVar5;
  tree_node_<libDAI::BoundTreeNode> *ptVar6;
  tree_node_<libDAI::BoundTreeNode> **pptVar7;
  
  ptVar6 = (tree_node_<libDAI::BoundTreeNode> *)operator_new(0x40);
  sVar3 = x->_index;
  (ptVar6->data)._id = x->_id;
  (ptVar6->data)._index = sVar3;
  bVar4 = x->_forcedleaf;
  uVar5 = *(undefined3 *)&x->field_0x15;
  (ptVar6->data)._type = x->_type;
  (ptVar6->data)._forcedleaf = bVar4;
  *(undefined3 *)&(ptVar6->data).field_0x15 = uVar5;
  ptVar6->first_child = (tree_node_<libDAI::BoundTreeNode> *)SUB168(ZEXT816(0) << 0x20,0);
  ptVar6->last_child = (tree_node_<libDAI::BoundTreeNode> *)SUB168(ZEXT816(0) << 0x20,8);
  ptVar1 = (position->super_iterator_base).node;
  ptVar6->parent = ptVar1;
  ptVar2 = ptVar1->last_child;
  pptVar7 = &ptVar2->next_sibling;
  if (ptVar2 == (tree_node_<libDAI::BoundTreeNode> *)0x0) {
    pptVar7 = &ptVar1->first_child;
  }
  *pptVar7 = ptVar6;
  ptVar6->prev_sibling = ptVar2;
  ptVar1->last_child = ptVar6;
  ptVar6->next_sibling = (tree_node_<libDAI::BoundTreeNode> *)0x0;
  (__return_storage_ptr__->super_iterator_base).node = ptVar6;
  (__return_storage_ptr__->super_iterator_base).skip_current_children_ = false;
  return __return_storage_ptr__;
}

Assistant:

iter tree<T, tree_node_allocator>::append_child(iter position, const T& x)
   {
   // If your program fails here you probably used 'append_child' to add the top
   // node to an empty tree. From version 1.45 the top element should be added
   // using 'insert'. See the documentation for further information, and sorry about
   // the API change.
   assert(position.node!=head);
   assert(position.node);

   tree_node* tmp = alloc_.allocate(1,0);
   kp::constructor(&tmp->data, x);
   tmp->first_child=0;
   tmp->last_child=0;

   tmp->parent=position.node;
   if(position.node->last_child!=0) {
      position.node->last_child->next_sibling=tmp;
      }
   else {
      position.node->first_child=tmp;
      }
   tmp->prev_sibling=position.node->last_child;
   position.node->last_child=tmp;
   tmp->next_sibling=0;
   return tmp;
   }